

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_manager.cpp
# Opt level: O1

TemporaryMemoryManager * __thiscall
duckdb::BufferManager::GetTemporaryMemoryManager(BufferManager *this)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"This type of BufferManager does not have a TemporaryMemoryManager"
             ,"");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TemporaryMemoryManager &BufferManager::GetTemporaryMemoryManager() {
	throw NotImplementedException("This type of BufferManager does not have a TemporaryMemoryManager");
}